

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inst.h
# Opt level: O0

shared_ptr<mocker::nasm::CJump>
mocker::nasm::dyc<mocker::nasm::CJump,std::shared_ptr<mocker::nasm::Inst>&>
          (shared_ptr<mocker::nasm::Inst> *v)

{
  shared_ptr<mocker::nasm::CJump> sVar1;
  shared_ptr<mocker::nasm::Inst> *v_local;
  
  sVar1 = std::dynamic_pointer_cast<mocker::nasm::CJump,mocker::nasm::Inst>(v);
  sVar1.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)v;
  return (shared_ptr<mocker::nasm::CJump>)
         sVar1.super___shared_ptr<mocker::nasm::CJump,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc(V &&v) {
  return std::dynamic_pointer_cast<T>(v);
}